

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glTF2Exporter.cpp
# Opt level: O3

uint __thiscall Assimp::glTF2Exporter::ExportNodeHierarchy(glTF2Exporter *this,aiNode *n)

{
  char *__s;
  pointer *ppRVar1;
  pointer *ppRVar2;
  float fVar3;
  Asset *this_00;
  Node *pNVar4;
  iterator __position;
  iterator __position_00;
  vector<glTF2::Node_*,_std::allocator<glTF2::Node_*>_> *pvVar5;
  uint uVar6;
  ulong uVar7;
  Ref<glTF2::Node> RVar8;
  allocator local_8d;
  uint local_8c;
  string local_88;
  char *local_68;
  Ref<glTF2::Node> local_60;
  string local_50;
  
  this_00 = (this->mAsset).super___shared_ptr<glTF2::Asset,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  __s = (n->mName).data;
  std::__cxx11::string::string((string *)&local_50,__s,&local_8d);
  glTF2::Asset::FindUniqueID(&local_88,this_00,&local_50,"node");
  RVar8 = glTF2::LazyDict<glTF2::Node>::Create(&this_00->nodes,local_88._M_dataplus._M_p);
  pvVar5 = RVar8.vector;
  uVar6 = RVar8.index;
  local_60.vector = pvVar5;
  local_60.index = uVar6;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_88._M_dataplus._M_p != &local_88.field_2) {
    operator_delete(local_88._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p);
  }
  pNVar4 = (pvVar5->super__Vector_base<glTF2::Node_*,_std::allocator<glTF2::Node_*>_>)._M_impl.
           super__Vector_impl_data._M_start[uVar6];
  local_68 = (char *)(pNVar4->super_Object).name._M_string_length;
  local_8c = uVar6;
  strlen(__s);
  std::__cxx11::string::_M_replace((ulong)&(pNVar4->super_Object).name,0,local_68,(ulong)__s);
  if (((((((0.01 < ABS((n->mTransformation).a2)) || (0.01 < ABS((n->mTransformation).a3))) ||
         (0.01 < ABS((n->mTransformation).a4))) ||
        ((0.01 < ABS((n->mTransformation).b1) || (0.01 < ABS((n->mTransformation).b3))))) ||
       (((0.01 < ABS((n->mTransformation).b4) ||
         ((0.01 < ABS((n->mTransformation).c1) || (0.01 < ABS((n->mTransformation).c2))))) ||
        (0.01 < ABS((n->mTransformation).c4))))) ||
      ((((0.01 < ABS((n->mTransformation).d1) || (0.01 < ABS((n->mTransformation).d2))) ||
        (0.01 < ABS((n->mTransformation).d3))) ||
       (((fVar3 = (n->mTransformation).a1, 1.01 < fVar3 || (fVar3 < 0.99)) ||
        ((fVar3 = (n->mTransformation).b2, 1.01 < fVar3 ||
         ((fVar3 < 0.99 || (fVar3 = (n->mTransformation).c3, 1.01 < fVar3)))))))))) ||
     ((fVar3 < 0.99 || ((fVar3 = (n->mTransformation).d4, 1.01 < fVar3 || (fVar3 < 0.99)))))) {
    ((pvVar5->super__Vector_base<glTF2::Node_*,_std::allocator<glTF2::Node_*>_>)._M_impl.
     super__Vector_impl_data._M_start[uVar6]->matrix).isPresent = true;
    CopyValue(&n->mTransformation,
              ((pvVar5->super__Vector_base<glTF2::Node_*,_std::allocator<glTF2::Node_*>_>)._M_impl.
               super__Vector_impl_data._M_start[uVar6]->matrix).value);
  }
  if (n->mNumMeshes != 0) {
    uVar7 = 0;
    do {
      pNVar4 = (pvVar5->super__Vector_base<glTF2::Node_*,_std::allocator<glTF2::Node_*>_>)._M_impl.
               super__Vector_impl_data._M_start[uVar6];
      local_88._M_string_length._0_4_ = n->mMeshes[uVar7];
      local_88._M_dataplus._M_p =
           (pointer)&(((this->mAsset).super___shared_ptr<glTF2::Asset,_(__gnu_cxx::_Lock_policy)2>.
                      _M_ptr)->meshes).mObjs;
      __position._M_current =
           *(pointer *)
            ((long)&(pNVar4->meshes).
                    super__Vector_base<glTF2::Ref<glTF2::Mesh>,_std::allocator<glTF2::Ref<glTF2::Mesh>_>_>
                    ._M_impl + 8);
      if (__position._M_current ==
          *(pointer *)
           ((long)&(pNVar4->meshes).
                   super__Vector_base<glTF2::Ref<glTF2::Mesh>,_std::allocator<glTF2::Ref<glTF2::Mesh>_>_>
                   ._M_impl + 0x10)) {
        std::vector<glTF2::Ref<glTF2::Mesh>,std::allocator<glTF2::Ref<glTF2::Mesh>>>::
        _M_realloc_insert<glTF2::Ref<glTF2::Mesh>>
                  ((vector<glTF2::Ref<glTF2::Mesh>,std::allocator<glTF2::Ref<glTF2::Mesh>>> *)
                   &pNVar4->meshes,__position,(Ref<glTF2::Mesh> *)&local_88);
      }
      else {
        (__position._M_current)->vector =
             (vector<glTF2::Mesh_*,_std::allocator<glTF2::Mesh_*>_> *)local_88._M_dataplus._M_p;
        *(ulong *)&(__position._M_current)->index =
             CONCAT44(local_88._M_string_length._4_4_,(uint)local_88._M_string_length);
        ppRVar1 = (pointer *)
                  ((long)&(pNVar4->meshes).
                          super__Vector_base<glTF2::Ref<glTF2::Mesh>,_std::allocator<glTF2::Ref<glTF2::Mesh>_>_>
                          ._M_impl + 8);
        *ppRVar1 = *ppRVar1 + 1;
      }
      uVar7 = uVar7 + 1;
    } while (uVar7 < n->mNumMeshes);
  }
  if (n->mNumChildren != 0) {
    uVar7 = 0;
    do {
      local_88._M_string_length._0_4_ = ExportNode(this,n->mChildren[uVar7],&local_60);
      pNVar4 = (pvVar5->super__Vector_base<glTF2::Node_*,_std::allocator<glTF2::Node_*>_>)._M_impl.
               super__Vector_impl_data._M_start[uVar6];
      local_88._M_dataplus._M_p =
           (pointer)&(((this->mAsset).super___shared_ptr<glTF2::Asset,_(__gnu_cxx::_Lock_policy)2>.
                      _M_ptr)->nodes).mObjs;
      __position_00._M_current =
           *(pointer *)
            ((long)&(pNVar4->children).
                    super__Vector_base<glTF2::Ref<glTF2::Node>,_std::allocator<glTF2::Ref<glTF2::Node>_>_>
                    ._M_impl + 8);
      if (__position_00._M_current ==
          *(pointer *)
           ((long)&(pNVar4->children).
                   super__Vector_base<glTF2::Ref<glTF2::Node>,_std::allocator<glTF2::Ref<glTF2::Node>_>_>
                   ._M_impl + 0x10)) {
        std::vector<glTF2::Ref<glTF2::Node>,std::allocator<glTF2::Ref<glTF2::Node>>>::
        _M_realloc_insert<glTF2::Ref<glTF2::Node>>
                  ((vector<glTF2::Ref<glTF2::Node>,std::allocator<glTF2::Ref<glTF2::Node>>> *)
                   &pNVar4->children,__position_00,(Ref<glTF2::Node> *)&local_88);
      }
      else {
        (__position_00._M_current)->vector =
             (vector<glTF2::Node_*,_std::allocator<glTF2::Node_*>_> *)local_88._M_dataplus._M_p;
        *(ulong *)&(__position_00._M_current)->index =
             CONCAT44(local_88._M_string_length._4_4_,(uint)local_88._M_string_length);
        ppRVar2 = (pointer *)
                  ((long)&(pNVar4->children).
                          super__Vector_base<glTF2::Ref<glTF2::Node>,_std::allocator<glTF2::Ref<glTF2::Node>_>_>
                          ._M_impl + 8);
        *ppRVar2 = *ppRVar2 + 1;
      }
      uVar7 = uVar7 + 1;
    } while (uVar7 < n->mNumChildren);
  }
  return local_8c;
}

Assistant:

unsigned int glTF2Exporter::ExportNodeHierarchy(const aiNode* n)
{
    Ref<Node> node = mAsset->nodes.Create(mAsset->FindUniqueID(n->mName.C_Str(), "node"));

    node->name = n->mName.C_Str();

    if (!n->mTransformation.IsIdentity()) {
        node->matrix.isPresent = true;
        CopyValue(n->mTransformation, node->matrix.value);
    }

    for (unsigned int i = 0; i < n->mNumMeshes; ++i) {
        node->meshes.push_back(mAsset->meshes.Get(n->mMeshes[i]));
    }

    for (unsigned int i = 0; i < n->mNumChildren; ++i) {
        unsigned int idx = ExportNode(n->mChildren[i], node);
        node->children.push_back(mAsset->nodes.Get(idx));
    }

    return node.GetIndex();
}